

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall OPL3::initOperators(OPL3 *this)

{
  Operator *this_00;
  int local_20;
  int local_1c;
  int offset;
  int group;
  int array;
  int baseAddress;
  OPL3 *this_local;
  
  memset(this->operators,0,0x200);
  for (offset = 0; offset < 2; offset = offset + 1) {
    for (local_1c = 0; local_1c < 0x11; local_1c = local_1c + 8) {
      for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
        this_00 = (Operator *)operator_new(0xb8);
        Operator::Operator(this_00,offset << 8 | local_1c + local_20);
        this->operators[offset][local_1c + local_20] = this_00;
      }
    }
  }
  this->highHatOperatorInNonRhythmMode = this->operators[0][0x11];
  this->snareDrumOperatorInNonRhythmMode = this->operators[0][0x14];
  this->tomTomOperatorInNonRhythmMode = this->operators[0][0x12];
  this->topCymbalOperatorInNonRhythmMode = this->operators[0][0x15];
  return;
}

Assistant:

void OPL3::initOperators() {
    int baseAddress;
    // The YMF262 has 36 operators:
	memset(operators, 0, sizeof(operators));
    for(int array=0; array<2; array++)
        for(int group = 0; group<=0x10; group+=8)
            for(int offset=0; offset<6; offset++) {
                baseAddress = (array<<8) | (group+offset);
                operators[array][group+offset] = new Operator(baseAddress);
            }
    
    // Save operators when they are in non-rhythm mode:
    // Channel 7:
    highHatOperatorInNonRhythmMode = operators[0][0x11];
    snareDrumOperatorInNonRhythmMode = operators[0][0x14];
    // Channel 8:
    tomTomOperatorInNonRhythmMode = operators[0][0x12];
    topCymbalOperatorInNonRhythmMode = operators[0][0x15];
    
}